

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifrnd(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *ctx_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  runsdef val;
  runsdef local_10;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x01') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  uVar2 = (ctx_00->runcxsp->runsv).runsvnum;
  if (uVar2 == 0) {
    lVar3 = 0;
  }
  else {
    uVar6 = ctx->bifcxrnd;
    if (ctx->bifcxrndset == 0) {
      uVar6 = (ulong)((int)uVar6 * 0x409 + 5U & 0x3fff);
      local_10.runsv.runsvstr = (uchar *)(uVar6 % uVar2 + 1);
      ctx->bifcxrnd = uVar6;
      runpush(ctx_00,1,&local_10);
      return;
    }
    lVar3 = (uVar6 / 0x1f31d) * 0x41a7;
    lVar5 = (uVar6 % 0x1f31d) * -0xb14;
    uVar6 = lVar5 + lVar3;
    uVar4 = lVar5 + 0x7fffffff + lVar3;
    if (0 < (long)uVar6) {
      uVar4 = uVar6;
    }
    ctx->bifcxrnd = uVar4;
    lVar3 = uVar4 % uVar2 + 1;
  }
  runpnum(ctx_00,lVar3);
  return;
}

Assistant:

void bifrnd(bifcxdef *ctx, int argc)
{
    unsigned long result, max, randseed;
    int      tmp;
    runsdef  val;

    /* get argument - number giving upper bound of generated number */
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_NUMBER);
    max = runpopnum(ctx->bifcxrun);

    /* if the max is zero, just return zero */
    if (max == 0)
    {
        runpnum(ctx->bifcxrun, 0);
        return;
    }

    /*
     *   If the random number generator has been seeded by a call to
     *   randomize(), use the new, improved random number generator.  If
     *   not, use the old random number generator to ensure that the same
     *   sequence of numbers is generated as always (to prevent breaking
     *   existing test scripts based on the old sequence). 
     */
    if (!ctx->bifcxrndset)
    {
        /* compute the next number in sequence, using old cheesy generator */
        randseed = ctx->bifcxrnd;
        randseed *= 1033;
        randseed += 5;
        tmp = randseed / 16384;
        randseed %= 16384;
        result = tmp / 7;

        /* adjust the result to be in the requested range */
        result = ( randseed % max ) + 1;
        
        /* save the new seed value, and return the value */
        ctx->bifcxrnd = randseed;
        val.runsv.runsvnum = result;
        runpush(ctx->bifcxrun, DAT_NUMBER, &val);
    }
    else
    {
#define BIF_RAND_M  ((ulong)2147483647)
#define BIF_RAND_Q  ((ulong)127773)
#define BIF_RAND_A  ((ulong)16807)
#define BIF_RAND_R  ((ulong)2836)

        long lo, hi, test;

        lo = ctx->bifcxrnd / BIF_RAND_Q;
        hi = ctx->bifcxrnd % BIF_RAND_Q;
        test = BIF_RAND_A*lo - BIF_RAND_R*hi;
        ctx->bifcxrnd = test;
        if (test > 0)
            ctx->bifcxrnd = test;
        else
            ctx->bifcxrnd = test + BIF_RAND_M;
        runpnum(ctx->bifcxrun, (((ulong)ctx->bifcxrnd) % max) + 1);
    }
}